

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensors.cpp
# Opt level: O1

Iterator * __thiscall iDynTree::SensorsList::Iterator::operator++(Iterator *this)

{
  pointer pvVar1;
  vector<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
  *pvVar2;
  vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_> *pvVar3;
  pointer pvVar4;
  Sensor **ppSVar5;
  
  ppSVar5 = (this->internalIterator)._M_current + 1;
  (this->internalIterator)._M_current = ppSVar5;
  if ((((this->externalIterator)._M_current)->
      super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>)._M_impl.
      super__Vector_impl_data._M_finish <= ppSVar5) {
    pvVar2 = this->iteratingList;
    do {
      pvVar3 = (this->externalIterator)._M_current;
      pvVar1 = pvVar3 + 1;
      (this->externalIterator)._M_current = pvVar1;
      pvVar4 = (pvVar2->
               super__Vector_base<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>,_std::allocator<std::vector<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      if (pvVar1 == pvVar4) {
        return this;
      }
    } while (pvVar3[1].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
             _M_impl.super__Vector_impl_data._M_start ==
             pvVar3[1].super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
    if (pvVar1 != pvVar4) {
      (this->internalIterator)._M_current =
           (pvVar1->super__Vector_base<iDynTree::Sensor_*,_std::allocator<iDynTree::Sensor_*>_>).
           _M_impl.super__Vector_impl_data._M_start;
    }
  }
  return this;
}

Assistant:

SensorsList::Iterator& SensorsList::Iterator::operator++()
    {
        ++internalIterator;
        if (internalIterator >= externalIterator->end()) {
            //end of inner list.
            //Move to next list
            do {
                ++externalIterator;
            } while (externalIterator != iteratingList.end() &&
                     externalIterator->empty());

            if (externalIterator != iteratingList.end()) {
                internalIterator = externalIterator->begin();
            }
        }
        return *this;
    }